

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cc
# Opt level: O3

string * __thiscall
EdgeEnv::MakePathList_abi_cxx11_
          (string *__return_storage_ptr__,EdgeEnv *this,Node **span,size_t size,char sep)

{
  long lVar1;
  long lVar2;
  string result;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (size != 0) {
    lVar2 = 0;
    do {
      if (__return_storage_ptr__->_M_string_length != 0) {
        std::__cxx11::string::push_back((char)__return_storage_ptr__);
      }
      lVar1 = **(long **)((long)span + lVar2);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_50,lVar1,(*(long **)((long)span + lVar2))[1] + lVar1);
      if (this->escape_in_out_ == kShellEscape) {
        GetShellEscapedString(&local_50,__return_storage_ptr__);
      }
      else {
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_50._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      lVar2 = lVar2 + 8;
    } while (size << 3 != lVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string EdgeEnv::MakePathList(const Node* const* const span,
                                  const size_t size, const char sep) const {
  string result;
  for (const Node* const* i = span; i != span + size; ++i) {
    if (!result.empty())
      result.push_back(sep);
    const string& path = (*i)->PathDecanonicalized();
    if (escape_in_out_ == kShellEscape) {
#ifdef _WIN32
      GetWin32EscapedString(path, &result);
#else
      GetShellEscapedString(path, &result);
#endif
    } else {
      result.append(path);
    }
  }
  return result;
}